

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

rtosc_arg_t rtosc_argument(char *msg,uint idx)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  char type;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint8_t *arg_mem;
  rtosc_arg_t rVar10;
  
  pcVar4 = msg + 1;
  do {
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  } while (cVar2 != '\0');
  do {
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    uVar7 = idx;
  } while (cVar2 == '\0');
  do {
    cVar2 = *pcVar4;
    if ((cVar2 != '[') && (cVar2 != ']')) {
      if ((uVar7 == 0) || (cVar2 == '\0')) {
        pbVar5 = (byte *)(msg + 1);
        do {
          bVar3 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar3 != 0);
        do {
          bVar3 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          uVar7 = idx;
        } while (bVar3 == 0);
        do {
          bVar3 = *pbVar5;
          if ((bVar3 != 0x5b) && (bVar3 != 0x5d)) {
            if ((uVar7 == 0) || (bVar3 == 0)) {
              uVar6 = 0;
              if ((bVar3 - 0x53 < 0x22) &&
                 ((0x3846b8001U >> ((ulong)(bVar3 - 0x53) & 0x3f) & 1) != 0)) {
                pcVar4 = msg + 5;
                do {
                  pcVar9 = pcVar4 + -4;
                  pcVar4 = pcVar4 + 1;
                } while (*pcVar9 != '\0');
                do {
                  pcVar9 = pcVar4;
                  pcVar4 = pcVar9 + 1;
                } while (pcVar9[-4] == '\0');
                pcVar9 = pcVar9 + -3;
                uVar6 = 1;
                do {
                  uVar8 = uVar6;
                  uVar6 = uVar8 + 1;
                  pcVar1 = pcVar4 + -3;
                  pcVar4 = pcVar4 + 1;
                } while (*pcVar1 != '\0');
                uVar8 = uVar8 + 4;
                if (-1 < (long)uVar6) {
                  uVar8 = uVar6;
                }
                for (; (*pcVar9 == '[' || (*pcVar9 == ']')); pcVar9 = pcVar9 + 1) {
                }
                arg_mem = (uint8_t *)(pcVar4 + -(uVar6 - (uVar8 & 0xfffffffffffffffc)));
                while (idx != 0) {
                  type = *pcVar9;
                  if ((type != '[') && (type != ']')) {
                    idx = idx - 1;
                    uVar7 = arg_size(arg_mem,type);
                    arg_mem = arg_mem + uVar7;
                  }
                  pcVar9 = pcVar9 + 1;
                }
                uVar6 = (ulong)(uint)((int)arg_mem - (int)msg);
              }
              rVar10 = extract_arg(msg + uVar6,cVar2);
              return rVar10;
            }
            uVar7 = uVar7 - 1;
          }
          pbVar5 = pbVar5 + 1;
        } while( true );
      }
      uVar7 = uVar7 - 1;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

rtosc_arg_t rtosc_argument(const char *msg, unsigned idx)
{
    char type = rtosc_type(msg, idx);
    uint8_t *arg_mem = (uint8_t*)msg + arg_off(msg, idx);
    return extract_arg(arg_mem, type);
}